

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

size_t pstore::sparse_array<std::__cxx11::string,unsigned_int>::required_bytes<unsigned_long_const*>
                 (size_t count,unsigned_long *first,unsigned_long *last)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = bitmap<unsigned_long_const*,void>(first,last);
  uVar2 = 0x20;
  if (uVar1 != 0) {
    uVar2 = (ulong)(uint)(POPCOUNT(uVar1) << 5);
  }
  return (uVar2 + count) - 0x20;
}

Assistant:

static std::size_t required_bytes (std::size_t const count, InputIterator const first,
                                           InputIterator const last) {
            // There will always be sufficient storage for at least 1 instance of
            // ValueType (this comes from the built-in array).
            static_assert (sizeof (elements_) / sizeof (ValueType) == 1U,
                           "Expected elements_ to be an array of 1 ValueType");
            auto const elements = std::max (bit_count::pop_count (bitmap (first, last)), 1U);
            return count - sizeof (elements_) + elements * sizeof (ValueType);
        }